

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O2

bool __thiscall Analyser::loadVariable(Analyser *this,string *var)

{
  _Optional_payload_base<int> _Var1;
  Instruction local_28;
  
  _Var1 = (_Optional_payload_base<int>)getIndexInLocal(this,var);
  if (((ulong)_Var1 >> 0x20 & 1) == 0) {
    _Var1 = (_Optional_payload_base<int>)getIndexInGlobal(this,var);
    if (((ulong)_Var1 & 0x100000000) == 0) {
      return false;
    }
    if (this->_currentFunction != -1) {
      local_28._opr = loada;
      local_28._x = 1;
      goto LAB_0010fece;
    }
  }
  local_28._opr = loada;
  local_28._x = 0;
LAB_0010fece:
  local_28._y = (int32_t)_Var1._M_payload;
  local_28._paramNum = 2;
  addInstruction(this,&local_28);
  return true;
}

Assistant:

bool Analyser::loadVariable(const std::string& var) {
	std::optional<std::int32_t> index = getIndexInLocal(var);
	if (index.has_value()) {
		addInstruction(Instruction(Operation::loada, 0, index.value()));
		return true;
	}
	index = getIndexInGlobal(var);
	if (index.has_value()) {
		if (_currentFunction == -1) {
			addInstruction(Instruction(Operation::loada, 0, index.value()));
		}
		else {
			addInstruction(Instruction(Operation::loada, 1, index.value()));
		}
		return true;
	}
	return false;
}